

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionUtils.h
# Opt level: O3

void __thiscall ExpressionUtils::~ExpressionUtils(ExpressionUtils *this)

{
  pointer ppEVar1;
  pointer ppEVar2;
  
  ppEVar2 = (this->deathMap).super__Vector_base<Expression_*,_std::allocator<Expression_*>_>._M_impl
            .super__Vector_impl_data._M_start;
  ppEVar1 = (this->deathMap).super__Vector_base<Expression_*,_std::allocator<Expression_*>_>._M_impl
            .super__Vector_impl_data._M_finish;
  if (ppEVar2 != ppEVar1) {
    do {
      if (*ppEVar2 != (Expression *)0x0) {
        (*(*ppEVar2)->_vptr_Expression[4])();
        ppEVar1 = (this->deathMap).super__Vector_base<Expression_*,_std::allocator<Expression_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      }
      ppEVar2 = ppEVar2 + 1;
    } while (ppEVar2 != ppEVar1);
    ppEVar2 = (this->deathMap).super__Vector_base<Expression_*,_std::allocator<Expression_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
  }
  if (ppEVar2 != (pointer)0x0) {
    operator_delete(ppEVar2,(long)(this->deathMap).
                                  super__Vector_base<Expression_*,_std::allocator<Expression_*>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppEVar2)
    ;
    return;
  }
  return;
}

Assistant:

~ExpressionUtils(){
        auto it = this->deathMap.begin();
        while (it != this->deathMap.end()){
            delete *it;
            it++;
        }
    }